

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O2

void av1_collect_mv_stats(AV1_COMP *cpi,int current_q)

{
  long lVar1;
  BLOCK_SIZE bsize;
  uint uVar2;
  uint uVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int mi_row;
  int mi_row_00;
  int mi_col;
  int mi_col_00;
  TileInfo tile_info;
  TileInfo local_48;
  
  uVar2 = (cpi->common).tiles.cols;
  uVar3 = (cpi->common).tiles.rows;
  uVar12 = 0;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar12;
  }
  for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
    av1_tile_set_row(&local_48,&cpi->common,(int)uVar12);
    for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      lVar1 = uVar11 + uVar12 * (long)(int)uVar2;
      av1_tile_set_col(&local_48,&cpi->common,(int)uVar11);
      memcpy(&cpi->tile_data[lVar1].tctx,(cpi->common).fc,0x52fc);
      iVar8 = local_48.mi_col_end;
      iVar7 = local_48.mi_col_start;
      iVar6 = local_48.mi_row_end;
      (cpi->td).mb.e_mbd.tile_ctx = &cpi->tile_data[lVar1].tctx;
      pSVar5 = (cpi->common).seq_params;
      iVar4 = pSVar5->mib_size;
      bsize = pSVar5->sb_size;
      for (mi_row_00 = local_48.mi_row_start; mi_col_00 = iVar7, mi_row_00 < iVar6;
          mi_row_00 = mi_row_00 + iVar4) {
        for (; mi_col_00 < iVar8; mi_col_00 = mi_col_00 + iVar4) {
          collect_mv_stats_sb(&cpi->mv_stats,cpi,mi_row_00,mi_col_00,bsize);
        }
      }
    }
  }
  (cpi->mv_stats).q = current_q;
  (cpi->mv_stats).order = (cpi->common).current_frame.order_hint;
  (cpi->mv_stats).valid = 1;
  return;
}

Assistant:

void av1_collect_mv_stats(AV1_COMP *cpi, int current_q) {
  MV_STATS *mv_stats = &cpi->mv_stats;
  const AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    TileInfo tile_info;
    av1_tile_set_row(&tile_info, cm, tile_row);
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      const int tile_idx = tile_row * tile_cols + tile_col;
      av1_tile_set_col(&tile_info, cm, tile_col);
      cpi->tile_data[tile_idx].tctx = *cm->fc;
      cpi->td.mb.e_mbd.tile_ctx = &cpi->tile_data[tile_idx].tctx;
      collect_mv_stats_tile(mv_stats, cpi, &tile_info);
    }
  }

  mv_stats->q = current_q;
  mv_stats->order = cpi->common.current_frame.order_hint;
  mv_stats->valid = 1;
}